

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

float Gia_ManLevelAve(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  Vec_Int_t *pVVar4;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  int iVar5;
  long lVar6;
  float fVar7;
  
  if (p->vLevels == (Vec_Int_t *)0x0) {
    __assert_fail("p->vLevels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x211,"float Gia_ManLevelAve(Gia_Man_t *)");
  }
  pVVar4 = p->vCos;
  uVar2 = pVVar4->nSize;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    fVar7 = 0.0;
  }
  else {
    lVar6 = 0;
    iVar5 = 0;
    do {
      uVar2 = (uint)uVar3;
      iVar1 = pVVar4->pArray[lVar6];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pVVar4 = p->vLevels;
      Vec_IntFillExtra(pVVar4,iVar1 + 1,(int)in_RDX);
      if (pVVar4->nSize <= iVar1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = iVar5 + pVVar4->pArray[iVar1];
      lVar6 = lVar6 + 1;
      pVVar4 = p->vCos;
      uVar2 = pVVar4->nSize;
      uVar3 = (ulong)(int)uVar2;
      in_RDX = extraout_RDX;
    } while (lVar6 < (long)uVar3);
    fVar7 = (float)iVar5;
  }
  return fVar7 / (float)(int)uVar2;
}

Assistant:

float Gia_ManLevelAve( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i, Ave = 0;
    assert( p->vLevels );
    Gia_ManForEachCo( p, pObj, i )
        Ave += Gia_ObjLevel(p, pObj);
    return (float)Ave / Gia_ManCoNum(p);
}